

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall
pstore::file::in_memory::in_memory
          (in_memory *this,shared_ptr<void> *buffer,uint64_t length,uint64_t eof,bool writable)

{
  int line;
  char *str;
  
  (this->super_file_base)._vptr_file_base = (_func_int **)&PTR__in_memory_001cf9c8;
  std::static_pointer_cast<unsigned_char,void>((shared_ptr<void> *)&this->buffer_);
  this->length_ = length;
  this->eof_ = eof;
  this->writable_ = writable;
  this->pos_ = 0;
  if ((buffer->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == (element_type *)0x0)
  {
    line = 0x1ef;
    str = "buffer != nullptr";
  }
  else {
    if (eof <= length) {
      return;
    }
    line = 0x1f0;
    str = "eof <= length";
  }
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/os/file.hpp"
                ,line);
}

Assistant:

in_memory (std::shared_ptr<void> const & buffer, std::uint64_t const length,
                       std::uint64_t const eof = 0, bool const writable = true) noexcept
                    : buffer_ (std::static_pointer_cast<std::uint8_t> (buffer))
                    , length_ (length)
                    , eof_ (eof)
                    , writable_ (writable) {

                PSTORE_ASSERT (buffer != nullptr);
                PSTORE_ASSERT (eof <= length);
            }